

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_alloter.cpp
# Opt level: O0

void * __thiscall cppnet::PoolAlloter::Malloc(PoolAlloter *this,uint32_t size)

{
  int iVar1;
  uint32_t uVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  MemNode *pMVar4;
  void *bytes;
  MemNode *result;
  MemNode **my_free;
  void *ret;
  uint32_t size_local;
  PoolAlloter *this_local;
  
  if (size < 0x101) {
    uVar2 = FreeListIndex(this,size,8);
    pMVar4 = (MemNode *)
             std::
             vector<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
             ::operator[](&this->_free_list,(ulong)uVar2);
    this_local = (PoolAlloter *)pMVar4->_next;
    if ((value_type)this_local == (value_type)0x0) {
      uVar2 = Alloter::Align(&this->super_Alloter,size);
      this_local = (PoolAlloter *)ReFill(this,uVar2,0x14);
    }
    else {
      *pMVar4 = *(MemNode *)this_local;
    }
  }
  else {
    peVar3 = std::__shared_ptr_access<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_alloter);
    iVar1 = (*peVar3->_vptr_Alloter[2])(peVar3,(ulong)size);
    this_local = (PoolAlloter *)CONCAT44(extraout_var,iVar1);
  }
  return this_local;
}

Assistant:

void* PoolAlloter::Malloc(uint32_t size) {
    if (size > __default_max_bytes) {
        void* ret = _alloter->Malloc(size);
        return ret;
    }
#ifdef __use_iocp__
    std::lock_guard<std::mutex> lock(_mutex);
#endif
    MemNode** my_free = &(_free_list[FreeListIndex(size)]);
    MemNode* result = *my_free;
    if (result == nullptr) {
        void* bytes = ReFill(Align(size));
        return bytes;
    }
    
    *my_free = result->_next;
    return result;
}